

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalDummyScan,duckdb::vector<duckdb::LogicalType,true>&,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,unsigned_long *args_1)

{
  PhysicalOperator *this_00;
  reference_wrapper<duckdb::PhysicalOperator> local_48;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  
  this_00 = (PhysicalOperator *)ArenaAllocator::AllocateAligned(&this->arena,0x80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  PhysicalDummyScan::PhysicalDummyScan
            ((PhysicalDummyScan *)this_00,(vector<duckdb::LogicalType,_true> *)&local_40,*args_1);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  local_48._M_data = this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_48);
  return this_00;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}